

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merged-constraint.cpp
# Opt level: O0

void baryonyx::itm::
     fill_merged_constraints<std::unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
               (context *ctx,
               unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
               *cache,operator_type op,problem *pb,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *ret)

{
  int iVar1;
  bool bVar2;
  problem_definition_failure *this;
  vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *pvVar3;
  pointer ppVar4;
  reference pvVar5;
  int *piVar6;
  pair<std::__detail::_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>,_bool>
  pVar7;
  int local_160;
  int local_15c;
  _Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
  local_158;
  undefined1 local_150;
  size_type local_148;
  _Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
  local_140;
  _Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
  local_138;
  iterator it_2;
  constraint *elem_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *__range3_2;
  int local_108;
  int local_104;
  _Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
  local_100;
  undefined1 local_f8;
  size_type local_f0;
  _Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
  local_e8;
  _Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
  local_e0;
  iterator it_1;
  constraint *elem_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *__range3_1;
  allocator<char> local_a1;
  string local_a0;
  int local_80;
  int local_7c;
  _Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
  local_78;
  undefined1 local_70;
  size_type local_68;
  _Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
  local_60;
  _Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
  local_58;
  iterator it;
  constraint *elem;
  const_iterator __end3;
  const_iterator __begin3;
  vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_> *__range3;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *ret_local;
  problem *pb_local;
  operator_type op_local;
  unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
  *cache_local;
  context *ctx_local;
  
  if (op == equal) {
    __end3 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::begin
                       (&pb->equal_constraints);
    elem = (constraint *)
           std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::end
                     (&pb->equal_constraints);
    while (bVar2 = __gnu_cxx::
                   operator==<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
                             (&__end3,(__normal_iterator<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
                                       *)&elem), ((bVar2 ^ 0xffU) & 1) != 0) {
      it.
      super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                 )__gnu_cxx::
                  __normal_iterator<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
                  ::operator*(&__end3);
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
           ::find(cache,(key_type *)
                        ((long)&(((__node_type *)
                                 it.
                                 super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                 ._M_cur)->
                                super__Hash_node_value<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>
                                ._M_storage._M_storage + 8));
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
           ::end(cache);
      bVar2 = std::__detail::operator==(&local_58,&local_60);
      if (bVar2) {
        pvVar3 = (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
                 ((long)it.
                        super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                        ._M_cur + 0x10);
        local_68 = std::
                   vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ::size(ret);
        pVar7 = std::
                unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>
                ::
                emplace<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,unsigned_long>
                          ((unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>
                            *)cache,pvVar3,&local_68);
        local_78._M_cur =
             (__node_type *)
             pVar7.first.
             super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
             ._M_cur;
        local_70 = pVar7.second;
        pvVar3 = (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
                 ((long)it.
                        super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                        ._M_cur + 0x10);
        local_7c = numeric_cast<int,int>
                             (*(int *)((long)it.
                                             super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                             ._M_cur + 0x28));
        local_80 = numeric_cast<int,int>
                             (*(int *)((long)it.
                                             super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                             ._M_cur + 0x28));
        std::
        vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>::
        emplace_back<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,int,int,int_const&>
                  ((vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>
                    *)ret,pvVar3,&local_7c,&local_80,
                   (int *)((long)it.
                                 super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                 ._M_cur + 0x2c));
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                               *)&local_58);
        pvVar5 = std::
                 vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ::operator[](ret,ppVar4->second);
        if (*(int *)((long)it.
                           super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                           ._M_cur + 0x28) < pvVar5->min) {
LAB_00c7ba16:
          piVar6 = (int *)((long)it.
                                 super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                 ._M_cur + 0x2c);
          ppVar4 = std::__detail::
                   _Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                                 *)&local_58);
          pvVar5 = std::
                   vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ::operator[](ret,ppVar4->second);
          error<int,int>(ctx,"Constraint {}: is inconsistent with previous {}.\n",piVar6,&pvVar5->id
                        );
          this = (problem_definition_failure *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"equal",&local_a1);
          problem_definition_failure::problem_definition_failure(this,&local_a0,multiple_constraint)
          ;
          __cxa_throw(this,&problem_definition_failure::typeinfo,
                      problem_definition_failure::~problem_definition_failure);
        }
        iVar1 = *(int *)((long)it.
                               super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                               ._M_cur + 0x28);
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                               *)&local_58);
        pvVar5 = std::
                 vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ::operator[](ret,ppVar4->second);
        if (pvVar5->max < iVar1) goto LAB_00c7ba16;
        iVar1 = *(int *)((long)it.
                               super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                               ._M_cur + 0x28);
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                               *)&local_58);
        pvVar5 = std::
                 vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ::operator[](ret,ppVar4->second);
        pvVar5->min = iVar1;
        iVar1 = *(int *)((long)it.
                               super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                               ._M_cur + 0x28);
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                               *)&local_58);
        pvVar5 = std::
                 vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ::operator[](ret,ppVar4->second);
        pvVar5->max = iVar1;
      }
      __gnu_cxx::
      __normal_iterator<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
      ::operator++(&__end3);
    }
  }
  else if (op == greater) {
    __end3_2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::begin
                         (&pb->greater_constraints);
    elem_2 = (constraint *)
             std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::end
                       (&pb->greater_constraints);
    while (bVar2 = __gnu_cxx::
                   operator==<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
                             (&__end3_2,
                              (__normal_iterator<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
                               *)&elem_2), ((bVar2 ^ 0xffU) & 1) != 0) {
      it_2.
      super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                 )__gnu_cxx::
                  __normal_iterator<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
                  ::operator*(&__end3_2);
      local_138._M_cur =
           (__node_type *)
           std::
           unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
           ::find(cache,(key_type *)
                        ((long)&(((__node_type *)
                                 it_2.
                                 super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                 ._M_cur)->
                                super__Hash_node_value<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>
                                ._M_storage._M_storage + 8));
      local_140._M_cur =
           (__node_type *)
           std::
           unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
           ::end(cache);
      bVar2 = std::__detail::operator==(&local_138,&local_140);
      if (bVar2) {
        pvVar3 = (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
                 ((long)it_2.
                        super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                        ._M_cur + 0x10);
        local_148 = std::
                    vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    ::size(ret);
        pVar7 = std::
                unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>
                ::
                emplace<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,unsigned_long>
                          ((unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>
                            *)cache,pvVar3,&local_148);
        local_158._M_cur =
             (__node_type *)
             pVar7.first.
             super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
             ._M_cur;
        local_150 = pVar7.second;
        pvVar3 = (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
                 ((long)it_2.
                        super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                        ._M_cur + 0x10);
        piVar6 = (int *)((long)it_2.
                               super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                               ._M_cur + 0x28);
        local_15c = std::numeric_limits<int>::max();
        std::
        vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>::
        emplace_back<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,int_const&,int,int_const&>
                  ((vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>
                    *)ret,pvVar3,piVar6,&local_15c,
                   (int *)((long)it_2.
                                 super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                 ._M_cur + 0x2c));
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                               *)&local_138);
        pvVar5 = std::
                 vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ::operator[](ret,ppVar4->second);
        local_160 = numeric_cast<int,int>
                              (*(int *)((long)it_2.
                                              super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                              ._M_cur + 0x28));
        piVar6 = std::max<int>(&pvVar5->min,&local_160);
        iVar1 = *piVar6;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                               *)&local_138);
        pvVar5 = std::
                 vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ::operator[](ret,ppVar4->second);
        pvVar5->min = iVar1;
      }
      __gnu_cxx::
      __normal_iterator<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
      ::operator++(&__end3_2);
    }
  }
  else if (op == less) {
    __end3_1 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::begin
                         (&pb->less_constraints);
    elem_1 = (constraint *)
             std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::end
                       (&pb->less_constraints);
    while (bVar2 = __gnu_cxx::
                   operator==<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
                             (&__end3_1,
                              (__normal_iterator<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
                               *)&elem_1), ((bVar2 ^ 0xffU) & 1) != 0) {
      it_1.
      super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                 )__gnu_cxx::
                  __normal_iterator<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
                  ::operator*(&__end3_1);
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
           ::find(cache,(key_type *)
                        ((long)&(((__node_type *)
                                 it_1.
                                 super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                 ._M_cur)->
                                super__Hash_node_value<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>
                                ._M_storage._M_storage + 8));
      local_e8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long,_baryonyx::itm::merged_constraint_hash,_std::equal_to<std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>_>,_std::allocator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>_>_>
           ::end(cache);
      bVar2 = std::__detail::operator==(&local_e0,&local_e8);
      if (bVar2) {
        pvVar3 = (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
                 ((long)it_1.
                        super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                        ._M_cur + 0x10);
        local_f0 = std::
                   vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   ::size(ret);
        pVar7 = std::
                unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>
                ::
                emplace<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,unsigned_long>
                          ((unordered_map<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>,unsigned_long,baryonyx::itm::merged_constraint_hash,std::equal_to<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>,std::allocator<std::pair<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const,unsigned_long>>>
                            *)cache,pvVar3,&local_f0);
        local_100._M_cur =
             (__node_type *)
             pVar7.first.
             super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
             ._M_cur;
        local_f8 = pVar7.second;
        pvVar3 = (vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_> *)
                 ((long)it_1.
                        super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                        ._M_cur + 0x10);
        local_104 = std::numeric_limits<int>::min();
        local_108 = numeric_cast<int,int>
                              (*(int *)((long)it_1.
                                              super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                              ._M_cur + 0x28));
        std::
        vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>::
        emplace_back<std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>const&,int,int,int_const&>
                  ((vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>
                    *)ret,pvVar3,&local_104,&local_108,
                   (int *)((long)it_1.
                                 super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                 ._M_cur + 0x2c));
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                               *)&local_e0);
        pvVar5 = std::
                 vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ::operator[](ret,ppVar4->second);
        __range3_2._4_4_ =
             numeric_cast<int,int>
                       (*(int *)((long)it_1.
                                       super__Node_iterator_base<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false>
                                       ._M_cur + 0x28));
        piVar6 = std::min<int>(&pvVar5->max,(int *)((long)&__range3_2 + 4));
        iVar1 = *piVar6;
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_std::vector<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>,_unsigned_long>,_false,_false>
                               *)&local_e0);
        pvVar5 = std::
                 vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 ::operator[](ret,ppVar4->second);
        pvVar5->max = iVar1;
      }
      __gnu_cxx::
      __normal_iterator<const_baryonyx::constraint_*,_std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>_>
      ::operator++(&__end3_1);
    }
  }
  return;
}

Assistant:

static void
fill_merged_constraints(const baryonyx::context& ctx,
                        cacheT& cache,
                        baryonyx::operator_type op,
                        const baryonyx::problem& pb,
                        retT& ret)
{
    switch (op) {
    case baryonyx::operator_type::equal:
        for (const auto& elem : pb.equal_constraints) {
            auto it = cache.find(elem.elements);
            if (it == cache.end()) {
                cache.emplace(elem.elements, ret.size());
                ret.emplace_back(elem.elements,
                                 baryonyx::numeric_cast<int>(elem.value),
                                 baryonyx::numeric_cast<int>(elem.value),
                                 elem.id);
            } else {
                if (ret[it->second].min <= elem.value &&
                    elem.value <= ret[it->second].max) {
                    ret[it->second].min = elem.value;
                    ret[it->second].max = elem.value;
                } else {
                    error(ctx,
                          "Constraint {}: is inconsistent with previous {}.\n",
                          elem.id,
                          ret[it->second].id);

                    throw problem_definition_failure(
                      "equal",
                      problem_definition_error_tag::multiple_constraint);
                }
            }
        }
        break;
    case baryonyx::operator_type::less:
        for (const auto& elem : pb.less_constraints) {
            auto it = cache.find(elem.elements);
            if (it == cache.end()) {
                cache.emplace(elem.elements, ret.size());
                ret.emplace_back(elem.elements,
                                 std::numeric_limits<int>::min(),
                                 baryonyx::numeric_cast<int>(elem.value),
                                 elem.id);
            } else {
                ret[it->second].max =
                  std::min(ret[it->second].max,
                           baryonyx::numeric_cast<int>(elem.value));
            }
        }
        break;
    case baryonyx::operator_type::greater:
        for (const auto& elem : pb.greater_constraints) {
            auto it = cache.find(elem.elements);
            if (it == cache.end()) {
                cache.emplace(elem.elements, ret.size());
                ret.emplace_back(elem.elements,
                                 elem.value,
                                 std::numeric_limits<int>::max(),
                                 elem.id);
            } else {
                ret[it->second].min =
                  std::max(ret[it->second].min,
                           baryonyx::numeric_cast<int>(elem.value));
            }
        }
        break;
    default:
        break;
    }
}